

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O2

void __thiscall cpp_client::Connection_internal::~Connection_internal(Connection_internal *this)

{
  if (this->sock_ != -1) {
    close(this->sock_);
  }
  std::__cxx11::string::~string((string *)&this->buffer_);
  return;
}

Assistant:

~Connection_internal()
   {
      if(sock_ != -1)
      {
         close(sock_);
      }
   }